

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [64];
  int iVar10;
  _func_int *p_Var11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  float fVar15;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  pp_Var3 = this->_vptr_Clip_x86_avx512;
  uVar8 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pauVar9 = (undefined1 (*) [64])
              (bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
              (long)bottom_top_blob->data);
    auVar12 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var3[-3])));
    auVar13 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var3[-3])));
    for (iVar10 = 0; iVar10 + 0xf < iVar6; iVar10 = iVar10 + 0x10) {
      auVar14 = vmaxps_avx512f(auVar12,*pauVar9);
      auVar14 = vminps_avx512f(auVar14,auVar13);
      *pauVar9 = auVar14;
      pauVar9 = pauVar9 + 1;
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar17._4_4_ = uVar1;
    auVar17._0_4_ = uVar1;
    auVar17._8_4_ = uVar1;
    auVar17._12_4_ = uVar1;
    auVar17._16_4_ = uVar1;
    auVar17._20_4_ = uVar1;
    auVar17._24_4_ = uVar1;
    auVar17._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
    auVar19._4_4_ = uVar1;
    auVar19._0_4_ = uVar1;
    auVar19._8_4_ = uVar1;
    auVar19._12_4_ = uVar1;
    auVar19._16_4_ = uVar1;
    auVar19._20_4_ = uVar1;
    auVar19._24_4_ = uVar1;
    auVar19._28_4_ = uVar1;
    for (; iVar10 + 7 < iVar6; iVar10 = iVar10 + 8) {
      auVar5 = vmaxps_avx(auVar17,*(undefined1 (*) [32])*pauVar9);
      auVar5 = vminps_avx(auVar5,auVar19);
      *(undefined1 (*) [32])*pauVar9 = auVar5;
      pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
    auVar18._4_4_ = uVar1;
    auVar18._0_4_ = uVar1;
    auVar18._8_4_ = uVar1;
    auVar18._12_4_ = uVar1;
    for (; iVar10 + 3 < iVar6; iVar10 = iVar10 + 4) {
      auVar4 = vmaxps_avx(auVar16,*(undefined1 (*) [16])*pauVar9);
      auVar4 = vminps_avx(auVar4,auVar18);
      *(undefined1 (*) [16])*pauVar9 = auVar4;
      pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
    }
    for (; iVar10 < iVar6; iVar10 = iVar10 + 1) {
      p_Var11 = pp_Var3[-3];
      fVar2 = *(float *)(&this->field_0xd0 + (long)p_Var11);
      fVar15 = *(float *)*pauVar9;
      if (*(float *)*pauVar9 < fVar2) {
        *(float *)*pauVar9 = fVar2;
        p_Var11 = pp_Var3[-3];
        fVar15 = fVar2;
      }
      if (*(float *)(&this->field_0xd4 + (long)p_Var11) < fVar15) {
        *(float *)*pauVar9 = *(float *)(&this->field_0xd4 + (long)p_Var11);
      }
      pauVar9 = (undefined1 (*) [64])(*pauVar9 + 4);
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}